

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetGlobalRecordKeyList
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this)

{
  ByteData local_50;
  undefined8 *local_38;
  wally_map_item *item;
  size_t idx;
  void *local_20;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *result;
  
  local_20 = this->wally_psbt_pointer_;
  idx._7_1_ = 0;
  psbt_pointer = (wally_psbt *)this;
  this_local = (Psbt *)__return_storage_ptr__;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (__return_storage_ptr__);
  for (item = (wally_map_item *)0x0; item < *(wally_map_item **)((long)local_20 + 0x48);
      item = (wally_map_item *)((long)&item->key + 1)) {
    local_38 = (undefined8 *)(*(long *)((long)local_20 + 0x40) + (long)item * 0x20);
    ByteData::ByteData(&local_50,(uint8_t *)*local_38,*(uint32_t *)(local_38 + 1));
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_50);
    ByteData::~ByteData(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetGlobalRecordKeyList() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;
  for (size_t idx = 0; idx < psbt_pointer->unknowns.num_items; ++idx) {
    auto item = &psbt_pointer->unknowns.items[idx];
    result.emplace_back(
        ByteData(item->key, static_cast<uint32_t>(item->key_len)));
  }
  return result;
}